

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *structNode,Reader *replacement,uint64_t scopeId,
          uint64_t replacementScopeId)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  Fault local_120;
  Fault f_1;
  Reader local_e8;
  uint local_b8;
  uint local_b4;
  uint i;
  uint local_ac;
  undefined1 local_a8 [4];
  uint count;
  Reader replacementFields;
  Reader fields;
  Fault local_38;
  Fault f;
  uint64_t replacementScopeId_local;
  uint64_t scopeId_local;
  Reader *replacement_local;
  Reader *structNode_local;
  CompatibilityChecker *this_local;
  
  f.exception = (Exception *)replacementScopeId;
  uVar2 = capnp::schema::Node::Struct::Reader::getDataWordCount(replacement);
  uVar3 = capnp::schema::Node::Struct::Reader::getDataWordCount(structNode);
  if (uVar3 < uVar2) {
    replacementIsNewer(this);
  }
  else {
    uVar2 = capnp::schema::Node::Struct::Reader::getDataWordCount(replacement);
    uVar3 = capnp::schema::Node::Struct::Reader::getDataWordCount(structNode);
    if (uVar2 < uVar3) {
      replacementIsOlder(this);
    }
  }
  uVar2 = capnp::schema::Node::Struct::Reader::getPointerCount(replacement);
  uVar3 = capnp::schema::Node::Struct::Reader::getPointerCount(structNode);
  if (uVar3 < uVar2) {
    replacementIsNewer(this);
  }
  else {
    uVar2 = capnp::schema::Node::Struct::Reader::getPointerCount(replacement);
    uVar3 = capnp::schema::Node::Struct::Reader::getPointerCount(structNode);
    if (uVar2 < uVar3) {
      replacementIsOlder(this);
    }
  }
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(replacement);
  uVar3 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(structNode);
  if (uVar3 < uVar2) {
    replacementIsNewer(this);
  }
  else {
    uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(replacement);
    uVar3 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(structNode);
    if (uVar2 < uVar3) {
      replacementIsOlder(this);
    }
  }
  uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(replacement);
  if ((uVar2 != 0) &&
     (uVar2 = capnp::schema::Node::Struct::Reader::getDiscriminantCount(structNode), uVar2 != 0)) {
    uVar4 = capnp::schema::Node::Struct::Reader::getDiscriminantOffset(replacement);
    uVar5 = capnp::schema::Node::Struct::Reader::getDiscriminantOffset(structNode);
    if (uVar4 != uVar5) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x2f6,FAILED,
                 "replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset()",
                 "\"union discriminant position changed\"",
                 (char (*) [36])"union discriminant position changed");
      this->compatibility = INCOMPATIBLE;
      kj::_::Debug::Fault::~Fault(&local_38);
      return;
    }
  }
  capnp::schema::Node::Struct::Reader::getFields
            ((Reader *)&replacementFields.reader.nestingLimit,structNode);
  capnp::schema::Node::Struct::Reader::getFields((Reader *)local_a8,replacement);
  i = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size
                ((Reader *)&replacementFields.reader.nestingLimit);
  local_b4 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)local_a8);
  puVar8 = std::min<unsigned_int>(&i,&local_b4);
  local_ac = *puVar8;
  uVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)local_a8);
  uVar7 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size
                    ((Reader *)&replacementFields.reader.nestingLimit);
  if (uVar7 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    uVar6 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size((Reader *)local_a8);
    uVar7 = List<capnp::schema::Field,_(capnp::Kind)3>::Reader::size
                      ((Reader *)&replacementFields.reader.nestingLimit);
    if (uVar6 < uVar7) {
      replacementIsOlder(this);
    }
  }
  for (local_b8 = 0; local_b8 < local_ac; local_b8 = local_b8 + 1) {
    List<capnp::schema::Field,_(capnp::Kind)3>::Reader::operator[]
              (&local_e8,(Reader *)&replacementFields.reader.nestingLimit,local_b8);
    List<capnp::schema::Field,_(capnp::Kind)3>::Reader::operator[]
              ((Reader *)&f_1,(Reader *)local_a8,local_b8);
    checkCompatibility(this,&local_e8,(Reader *)&f_1);
  }
  bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(structNode);
  if (bVar1) {
    bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(replacement);
    if (bVar1) {
      if (f.exception != (Exception *)scopeId) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
                  (&local_120,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                   ,0x311,FAILED,"replacementScopeId == scopeId","\"group node\'s scope changed\"",
                   (char (*) [27])"group node\'s scope changed");
        this->compatibility = INCOMPATIBLE;
        kj::_::Debug::Fault::~Fault(&local_120);
      }
    }
    else {
      replacementIsOlder(this);
    }
  }
  else {
    bVar1 = capnp::schema::Node::Struct::Reader::getIsGroup(replacement);
    if (bVar1) {
      replacementIsNewer(this);
    }
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Struct::Reader& structNode,
                          const schema::Node::Struct::Reader& replacement,
                          uint64_t scopeId, uint64_t replacementScopeId) {
    if (replacement.getDataWordCount() > structNode.getDataWordCount()) {
      replacementIsNewer();
    } else if (replacement.getDataWordCount() < structNode.getDataWordCount()) {
      replacementIsOlder();
    }
    if (replacement.getPointerCount() > structNode.getPointerCount()) {
      replacementIsNewer();
    } else if (replacement.getPointerCount() < structNode.getPointerCount()) {
      replacementIsOlder();
    }
    if (replacement.getDiscriminantCount() > structNode.getDiscriminantCount()) {
      replacementIsNewer();
    } else if (replacement.getDiscriminantCount() < structNode.getDiscriminantCount()) {
      replacementIsOlder();
    }

    if (replacement.getDiscriminantCount() > 0 && structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset(),
                      "union discriminant position changed");
    }

    // The shared members should occupy corresponding positions in the member lists, since the
    // lists are sorted by ordinal.
    auto fields = structNode.getFields();
    auto replacementFields = replacement.getFields();
    uint count = std::min(fields.size(), replacementFields.size());

    if (replacementFields.size() > fields.size()) {
      replacementIsNewer();
    } else if (replacementFields.size() < fields.size()) {
      replacementIsOlder();
    }

    for (uint i = 0; i < count; i++) {
      checkCompatibility(fields[i], replacementFields[i]);
    }

    // For the moment, we allow "upgrading" from non-group to group, mainly so that the
    // placeholders we generate for group parents (which in the absence of more info, we assume to
    // be non-groups) can be replaced with groups.
    //
    // TODO(cleanup):  The placeholder approach is really breaking down.  Maybe we need to maintain
    //   a list of expectations for nodes we haven't loaded yet.
    if (structNode.getIsGroup()) {
      if (replacement.getIsGroup()) {
        VALIDATE_SCHEMA(replacementScopeId == scopeId, "group node's scope changed");
      } else {
        replacementIsOlder();
      }
    } else {
      if (replacement.getIsGroup()) {
        replacementIsNewer();
      }
    }
  }